

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_compact.hpp
# Opt level: O2

void __thiscall
Catch::CompactReporter::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  string local_30;
  
  if ((this->result->m_info).capturedExpression._M_string_length != 0) {
    poVar1 = std::operator<<(this->stream," ");
    AssertionResult::getExpression_abi_cxx11_(&local_30,this->result);
    std::operator<<(poVar1,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
                if( result.hasExpression() ) {
                    stream << " " << result.getExpression();
                }
            }